

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O1

int __thiscall FScanner::MatchString(FScanner *this,char **strings,size_t stride)

{
  char *__s2;
  int iVar1;
  char *__s1;
  int iVar2;
  char **ppcVar3;
  
  if ((stride & 7) != 0) {
    __assert_fail("stride % sizeof(const char*) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sc_man.cpp"
                  ,0x345,"int FScanner::MatchString(const char *const *, size_t)");
  }
  __s1 = *strings;
  if (__s1 != (char *)0x0) {
    __s2 = this->String;
    ppcVar3 = strings + (stride >> 3);
    iVar2 = 0;
    do {
      iVar1 = strcasecmp(__s1,__s2);
      if (iVar1 == 0) {
        return iVar2;
      }
      iVar2 = iVar2 + 1;
      __s1 = *ppcVar3;
      ppcVar3 = ppcVar3 + (stride >> 3);
    } while (__s1 != (char *)0x0);
  }
  return -1;
}

Assistant:

int FScanner::MatchString (const char * const *strings, size_t stride)
{
	int i;

	assert(stride % sizeof(const char*) == 0);

	stride /= sizeof(const char*);

	for (i = 0; *strings != NULL; i++)
	{
		if (Compare (*strings))
		{
			return i;
		}
		strings += stride;
	}
	return -1;
}